

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetIncludeDirectoriesCommand.cxx
# Opt level: O2

void __thiscall
cmTargetIncludeDirectoriesCommand::HandleInterfaceContent
          (cmTargetIncludeDirectoriesCommand *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool system)

{
  undefined3 in_register_00000081;
  string joined;
  allocator<char> local_61;
  string local_60;
  char *local_40 [4];
  
  cmTargetPropCommandBase::HandleInterfaceContent
            (&this->super_cmTargetPropCommandBase,tgt,content,prepend,system);
  if (CONCAT31(in_register_00000081,system) != 0) {
    (*(this->super_cmTargetPropCommandBase).super_cmCommand._vptr_cmCommand[10])
              (local_40,this,content);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",&local_61);
    cmTarget::AppendProperty(tgt,&local_60,local_40[0],false);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void cmTargetIncludeDirectoriesCommand::HandleInterfaceContent(
  cmTarget* tgt, const std::vector<std::string>& content, bool prepend,
  bool system)
{
  cmTargetPropCommandBase::HandleInterfaceContent(tgt, content, prepend,
                                                  system);

  if (system) {
    std::string joined = this->Join(content);
    tgt->AppendProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",
                        joined.c_str());
  }
}